

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CENamespace.cpp
# Opt level: O1

string * CppEphem::StrOpt::join<double>
                   (string *__return_storage_ptr__,vector<double,_std::allocator<double>_> *values,
                   char *delim)

{
  size_type sVar1;
  const_reference pvVar2;
  ostream *this;
  size_type sVar3;
  ostringstream ss;
  ostringstream aoStack_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
  sVar1 = std::vector<double,_std::allocator<double>_>::size(values);
  if (sVar1 != 0) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](values,0);
    std::ostream::operator<<((ostream *)aoStack_1a8,*pvVar2);
  }
  sVar1 = std::vector<double,_std::allocator<double>_>::size(values);
  if (1 < sVar1) {
    sVar1 = 1;
    do {
      this = std::operator<<((ostream *)aoStack_1a8,*delim);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](values,sVar1);
      std::ostream::operator<<(this,*pvVar2);
      sVar1 = sVar1 + 1;
      sVar3 = std::vector<double,_std::allocator<double>_>::size(values);
    } while (sVar1 < sVar3);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string CppEphem::StrOpt::join(const std::vector<T>& values,
                                   const char&           delim)
{
    // Assemble the first value in the string
    std::ostringstream ss;
    if (values.size() > 0) {
        ss << values[0];
    }

    // Now append the rest
    for (int i=1; i<values.size(); i++) { 
        ss << delim << values[i];
    }

    return ss.str();
}